

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

loader_impl loader_impl_create(char *tag)

{
  configuration pcVar1;
  loader_impl impl;
  char *in_stack_00000040;
  char *in_stack_ffffffffffffffe8;
  loader_impl local_8;
  
  local_8 = loader_impl_allocate(in_stack_ffffffffffffffe8);
  if (local_8 == (loader_impl)0x0) {
    local_8 = (loader_impl)0x0;
  }
  else {
    local_8->init = 1;
    local_8->options = (value)0x0;
    pcVar1 = loader_impl_initialize_configuration(in_stack_00000040);
    local_8->config = pcVar1;
  }
  return local_8;
}

Assistant:

loader_impl loader_impl_create(const loader_tag tag)
{
	loader_impl impl = loader_impl_allocate(tag);

	if (impl == NULL)
	{
		return NULL;
	}

	impl->init = 1;
	impl->options = NULL;

	/* Get the configuration of the loader */
	impl->config = loader_impl_initialize_configuration(tag);

	return impl;
}